

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

void __thiscall
cmELFInternalImpl<cmELFTypes32>::ByteSwap
          (cmELFInternalImpl<cmELFTypes32> *this,ELF_Shdr *sec_header)

{
  ushort *puVar1;
  Elf32_Word EVar2;
  Elf32_Addr EVar3;
  Elf32_Off EVar4;
  
  EVar2 = sec_header->sh_name;
  *(undefined1 *)&sec_header->sh_name = *(undefined1 *)((long)&sec_header->sh_name + 3);
  *(char *)((long)&sec_header->sh_name + 3) = (char)EVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_name + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar2 = sec_header->sh_type;
  *(undefined1 *)&sec_header->sh_type = *(undefined1 *)((long)&sec_header->sh_type + 3);
  *(char *)((long)&sec_header->sh_type + 3) = (char)EVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_type + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar2 = sec_header->sh_flags;
  *(undefined1 *)&sec_header->sh_flags = *(undefined1 *)((long)&sec_header->sh_flags + 3);
  *(char *)((long)&sec_header->sh_flags + 3) = (char)EVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_flags + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar3 = sec_header->sh_addr;
  *(undefined1 *)&sec_header->sh_addr = *(undefined1 *)((long)&sec_header->sh_addr + 3);
  *(char *)((long)&sec_header->sh_addr + 3) = (char)EVar3;
  puVar1 = (ushort *)((long)&sec_header->sh_addr + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar4 = sec_header->sh_offset;
  *(undefined1 *)&sec_header->sh_offset = *(undefined1 *)((long)&sec_header->sh_offset + 3);
  *(char *)((long)&sec_header->sh_offset + 3) = (char)EVar4;
  puVar1 = (ushort *)((long)&sec_header->sh_offset + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar2 = sec_header->sh_size;
  *(undefined1 *)&sec_header->sh_size = *(undefined1 *)((long)&sec_header->sh_size + 3);
  *(char *)((long)&sec_header->sh_size + 3) = (char)EVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_size + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar2 = sec_header->sh_link;
  *(undefined1 *)&sec_header->sh_link = *(undefined1 *)((long)&sec_header->sh_link + 3);
  *(char *)((long)&sec_header->sh_link + 3) = (char)EVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_link + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar2 = sec_header->sh_info;
  *(undefined1 *)&sec_header->sh_info = *(undefined1 *)((long)&sec_header->sh_info + 3);
  *(char *)((long)&sec_header->sh_info + 3) = (char)EVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_info + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar2 = sec_header->sh_addralign;
  *(undefined1 *)&sec_header->sh_addralign = *(undefined1 *)((long)&sec_header->sh_addralign + 3);
  *(char *)((long)&sec_header->sh_addralign + 3) = (char)EVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_addralign + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar2 = sec_header->sh_entsize;
  *(undefined1 *)&sec_header->sh_entsize = *(undefined1 *)((long)&sec_header->sh_entsize + 3);
  *(char *)((long)&sec_header->sh_entsize + 3) = (char)EVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_entsize + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

void cmELFByteSwap(char* data, cmELFByteSwapSize<4> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[3];
  data[3] = one_byte;
  one_byte = data[1];
  data[1] = data[2];
  data[2] = one_byte;
}